

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soap_ctrlpt.c
# Opt level: O1

int SoapSendAction(char *action_url,char *service_type,IXML_Document *action_node,
                  IXML_Document **response_node)

{
  bool bVar1;
  parse_status_t pVar2;
  int iVar3;
  int iVar4;
  char *__s;
  size_t sVar5;
  int upnp_error_code;
  memptr name;
  membuffer responsename;
  char *upnp_error_str;
  membuffer request;
  uri_type url;
  http_parser_t response;
  undefined8 in_stack_fffffffffffffc40;
  undefined4 uVar6;
  int local_34c;
  undefined4 local_348;
  undefined4 uStack_344;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  membuffer local_338;
  char *local_318;
  membuffer local_310;
  uri_type local_2f0;
  http_parser_t local_220;
  
  uVar6 = (undefined4)((ulong)in_stack_fffffffffffffc40 >> 0x20);
  *response_node = (IXML_Document *)0x0;
  UpnpPrintf(UPNP_INFO,SOAP,".upnp/src/soap/soap_ctrlpt.c",0x228,"Inside SoapSendAction():");
  membuffer_init(&local_310);
  membuffer_init(&local_338);
  __s = ixmlPrintNode(&action_node->n);
  iVar4 = -0x68;
  bVar1 = true;
  if (__s != (char *)0x0) {
    sVar5 = strlen(__s);
    pVar2 = matchstr(__s,sVar5," <%s:%s",&local_220,&local_348);
    if (pVar2 == PARSE_OK) {
      sVar5 = strlen(action_url);
      iVar3 = http_FixStrUrl(action_url,sVar5,&local_2f0);
      if (iVar3 == 0) {
        UpnpPrintf(UPNP_INFO,SOAP,".upnp/src/soap/soap_ctrlpt.c",0x241,"path=%.*s, hostport=%.*s\n",
                   (ulong)(uint)local_2f0.pathquery.size,local_2f0.pathquery.buff,
                   CONCAT44(uVar6,(undefined4)local_2f0.hostport.text.size),
                   local_2f0.hostport.text.buff);
        sVar5 = strlen(__s);
        local_310.size_inc = 0x32;
        iVar3 = http_MakeMessage(&local_310,1,1,"qNssssbscUcbbb",0xb,&local_2f0,sVar5 + 0xa2,
                                 ContentTypeHeader,"SOAPACTION: \"",service_type,"#",local_348,
                                 uStack_340,"\"",
                                 "<s:Envelope xmlns:s=\"http://schemas.xmlsoap.org/soap/envelope/\" s:encodingStyle=\"http://schemas.xmlsoap.org/soap/encoding/\">\r\n<s:Body>"
                                 ,0x86,__s,sVar5,"</s:Body>\r\n</s:Envelope>\r\n\r\n",0x1c);
        if (iVar3 == 0) {
          iVar3 = soap_request_and_response(&local_310,&local_2f0,&local_220);
          if (iVar3 == 0) {
            iVar3 = membuffer_append(&local_338,(void *)CONCAT44(uStack_344,local_348),
                                     CONCAT44(uStack_33c,uStack_340));
            if (iVar3 == 0) {
              iVar3 = membuffer_append_str(&local_338,"Response");
              bVar1 = false;
              if (iVar3 != 0) goto LAB_0011abe2;
              iVar4 = get_response_value(&local_220.msg,1,local_338.buf,&local_34c,
                                         (IXML_Node **)response_node,&local_318);
              if (iVar4 == 1) {
                iVar4 = 0;
                goto LAB_0011abe2;
              }
              if (iVar4 == 3) {
                iVar4 = local_34c;
              }
            }
            bVar1 = false;
          }
          else {
            bVar1 = false;
            iVar4 = iVar3;
          }
        }
      }
      else {
        iVar4 = -0x6c;
      }
    }
    else {
      iVar4 = -0x73;
    }
  }
LAB_0011abe2:
  ixmlFreeDOMString(__s);
  membuffer_destroy(&local_310);
  membuffer_destroy(&local_338);
  if (!bVar1) {
    httpmsg_destroy(&local_220.msg);
  }
  return iVar4;
}

Assistant:

int SoapSendAction(char *action_url,
	char *service_type,
	IXML_Document *action_node,
	IXML_Document **response_node)
{
	char *action_str = NULL;
	memptr name;
	membuffer request;
	membuffer responsename;
	int err_code;
	int ret_code;
	http_parser_t response;
	uri_type url;
	int upnp_error_code;
	char *upnp_error_str;
	int got_response = 0;

	off_t content_length;
	const char *xml_start =
		"<s:Envelope "
		"xmlns:s=\"http://schemas.xmlsoap.org/soap/envelope/\" "
		"s:encodingStyle=\"http://schemas.xmlsoap.org/soap/encoding/"
		"\">\r\n"
		"<s:Body>";
	const char *xml_end = "</s:Body>\r\n"
			      "</s:Envelope>\r\n\r\n";
	size_t xml_start_len;
	size_t xml_end_len;
	size_t action_str_len;

	*response_node = NULL; /* init */

	err_code = UPNP_E_OUTOF_MEMORY; /* default error */

	UpnpPrintf(UPNP_INFO,
		SOAP,
		__FILE__,
		__LINE__,
		"Inside SoapSendAction():");
	/* init */
	membuffer_init(&request);
	membuffer_init(&responsename);

	/* print action */
	action_str = ixmlPrintNode((IXML_Node *)action_node);
	if (action_str == NULL) {
		goto error_handler;
	}
	/* get action name */
	if (get_action_name(action_str, &name) != 0) {
		err_code = UPNP_E_INVALID_ACTION;
		goto error_handler;
	}
	/* parse url */
	if (http_FixStrUrl(action_url, strlen(action_url), &url) != 0) {
		err_code = UPNP_E_INVALID_URL;
		goto error_handler;
	}

	UpnpPrintf(UPNP_INFO,
		SOAP,
		__FILE__,
		__LINE__,
		"path=%.*s, hostport=%.*s\n",
		(int)url.pathquery.size,
		url.pathquery.buff,
		(int)url.hostport.text.size,
		url.hostport.text.buff);

	xml_start_len = strlen(xml_start);
	xml_end_len = strlen(xml_end);
	action_str_len = strlen(action_str);

	/* make request msg */
	request.size_inc = 50;
	content_length = (off_t)(xml_start_len + action_str_len + xml_end_len);
	if (http_MakeMessage(&request,
		    1,
		    1,
		    "q"
		    "N"
		    "s"
		    "sssbsc"
		    "Uc"
		    "b"
		    "b"
		    "b",
		    SOAPMETHOD_POST,
		    &url,
		    content_length,
		    ContentTypeHeader,
		    "SOAPACTION: \"",
		    service_type,
		    "#",
		    name.buf,
		    name.length,
		    "\"",
		    xml_start,
		    xml_start_len,
		    action_str,
		    action_str_len,
		    xml_end,
		    xml_end_len) != 0) {
		goto error_handler;
	}

	ret_code = soap_request_and_response(&request, &url, &response);
	got_response = 1;
	if (ret_code != UPNP_E_SUCCESS) {
		err_code = ret_code;
		goto error_handler;
	}

	if (membuffer_append(&responsename, name.buf, name.length) != 0 ||
		membuffer_append_str(&responsename, "Response") != 0) {
		goto error_handler;
	}
	/* get action node from the response */
	ret_code = get_response_value(&response.msg,
		SOAP_ACTION_RESP,
		responsename.buf,
		&upnp_error_code,
		(IXML_Node **)response_node,
		&upnp_error_str);

	if (ret_code == SOAP_ACTION_RESP) {
		err_code = UPNP_E_SUCCESS;
	} else if (ret_code == SOAP_ACTION_RESP_ERROR) {
		err_code = upnp_error_code;
	} else {
		err_code = ret_code;
	}

error_handler:
	ixmlFreeDOMString(action_str);
	membuffer_destroy(&request);
	membuffer_destroy(&responsename);
	if (got_response) {
		httpmsg_destroy(&response.msg);
	}

	return err_code;
}